

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O2

int b_extract(lua_State *L)

{
  uint uVar1;
  undefined8 in_RAX;
  ulong uVar2;
  int w;
  
  w._0_1_ = (char)((ulong)in_RAX >> 0x20);
  uVar2 = luaL_checkinteger(L,1);
  uVar1 = fieldargs(L,2,&w);
  lua_pushinteger(L,(ulong)(~(uint)(0x1fffffffe << ((ulong)(byte)((char)w - 1) & 0x3f)) &
                           (uint)((uVar2 & 0xffffffff) >> ((ulong)uVar1 & 0x3f))));
  return 1;
}

Assistant:

static int b_extract (lua_State *L) {
  int w;
  lua_Unsigned r = trim(checkunsigned(L, 1));
  int f = fieldargs(L, 2, &w);
  r = (r >> f) & mask(w);
  pushunsigned(L, r);
  return 1;
}